

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O0

void struct_suite::fail_invalid_second(void)

{
  error *ex;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  person value;
  iarchive in;
  value_type input [8];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x918143424103a990;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[8]>
            ((iarchive *)&value.age,
             (uchar (*) [8])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
  person::person((person *)local_d8,&local_f8,99);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)&value.age,
             (person *)local_d8);
  trial::protocol::core::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x299,"void struct_suite::fail_invalid_second()");
  person::~person((person *)local_d8);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)&value.age);
  return;
}

Assistant:

void fail_invalid_second()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::string8, 0x03, 0x41, 0x42, 0x43,
                                 token::code::true_value,
                                 token::code::end_record };
    format::iarchive in(input);
    person value("", 99);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "invalid value");
}